

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O2

bool fs_is_prefix(string_view prefix,string_view path)

{
  __type _Var1;
  __type _Var2;
  string p;
  string pr;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (path._M_len == 0 || prefix._M_len == 0) {
    _Var2 = false;
  }
  else {
    fs_drop_slash_abi_cxx11_(&local_50,prefix);
    fs_drop_slash_abi_cxx11_(&local_70,path);
    _Var1 = std::operator==(&local_50,&local_70);
    _Var2 = true;
    if (!_Var1) {
      if (local_70._M_string_length < local_50._M_string_length) {
        _Var2 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_30,(ulong)&local_70);
        _Var2 = std::operator==(&local_30,&local_50);
        std::__cxx11::string::~string((string *)&local_30);
      }
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return _Var2;
}

Assistant:

bool
fs_is_prefix(std::string_view prefix, std::string_view path)
{
  // is prefix a prefix of path. Does not normalize, canonicalize, or walk up the directory tree.
  // ".." is ambiguous and should be avoided in input

  if(prefix.empty() || path.empty())
    return false;

  std::string const pr = fs_drop_slash(prefix);
  std::string const p = fs_drop_slash(path);

  if (pr == p)
    return true;

  if (pr.size() > p.size())
    return false;

#ifdef __cpp_lib_starts_ends_with  // C++20
  return p.starts_with(pr);
#else
  return p.substr(0, pr.size()) == pr;
#endif

}